

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O1

bool __thiscall wasm::WATParser::anon_unknown_10::LexIntCtx::takeHexdigit(LexIntCtx *this)

{
  size_t *psVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  string_view sVar6;
  
  if ((this->super_LexCtx).input._M_len == (this->super_LexCtx).lexedSize) {
    return false;
  }
  sVar6 = LexCtx::next(&this->super_LexCtx);
  cVar2 = *sVar6._M_str;
  iVar3 = (int)cVar2;
  if ((byte)(cVar2 - 0x30U) < 10) {
    iVar3 = iVar3 + -0x30;
  }
  else {
    if (5 < (byte)(cVar2 + 0xbfU)) {
      bVar5 = (byte)(cVar2 + 0x9fU) < 6;
      iVar3 = iVar3 + -0x57;
      goto LAB_009f2b9a;
    }
    iVar3 = iVar3 + -0x37;
  }
  bVar5 = true;
LAB_009f2b9a:
  if (bVar5) {
    psVar1 = &(this->super_LexCtx).lexedSize;
    *psVar1 = *psVar1 + 1;
    uVar4 = (long)iVar3 + this->n * 0x10;
    if (uVar4 < this->n) {
      this->overflow = true;
    }
    this->n = uVar4;
    if (bVar5) {
      return true;
    }
  }
  return false;
}

Assistant:

bool takeHexdigit() {
    if (!empty()) {
      if (auto h = getHexDigit(peek())) {
        take(1);
        uint64_t newN = n * 16 + *h;
        if (newN < n) {
          overflow = true;
        }
        n = newN;
        return true;
      }
    }
    return false;
  }